

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,DomProperty*>::emplace<DomProperty*const&>
          (QHash<QString,DomProperty*> *this,QString *key,DomProperty **args)

{
  Data<QHashPrivate::Node<QString,_DomProperty_*>_> *pDVar1;
  DomProperty *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QString,_DomProperty_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = *(DomProperty **)this;
  if (pDVar2 == (DomProperty *)0x0) {
    local_28.d = (Data *)0x0;
LAB_00135d71:
    pDVar2 = (DomProperty *)0x0;
LAB_00135d92:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_DomProperty_*>_>::detached
                       ((Data<QHashPrivate::Node<QString,_DomProperty_*>_> *)pDVar2);
    *(Data<QHashPrivate::Node<QString,_DomProperty_*>_> **)this = pDVar1;
  }
  else {
    if (*(uint *)&(pDVar2->m_attr_name).d.d < 2) {
      if ((pDVar2->m_attr_name).d.ptr < (char16_t *)((ulong)(pDVar2->m_attr_name).d.size >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<DomProperty*const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar3 = (piter)emplace_helper<DomProperty*>(this,key,(DomProperty **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_00135dfa;
    }
    local_28.d = (Data *)pDVar2;
    if (*(int *)&(pDVar2->m_attr_name).d.d != -1) {
      LOCK();
      *(int *)&(pDVar2->m_attr_name).d.d = *(int *)&(pDVar2->m_attr_name).d.d + 1;
      UNLOCK();
      pDVar2 = *(DomProperty **)this;
      if (pDVar2 == (DomProperty *)0x0) goto LAB_00135d71;
    }
    if (1 < *(uint *)&(pDVar2->m_attr_name).d.d) goto LAB_00135d92;
  }
  pVar3 = (piter)emplace_helper<DomProperty*const&>(this,key,args);
  QHash<QString,_DomProperty_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00135dfa:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }